

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

Instr * __thiscall Inline::DoCheckThisOpt(Inline *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ThisInfo TVar5;
  undefined4 *puVar6;
  BailOutInstrTemplate<IR::Instr> *this_00;
  Instr *pIVar7;
  JITTimeProfileInfo *pJVar8;
  
  pIVar7 = instr->m_next;
  uVar3 = Func::GetSourceContextId(instr->m_func->topFunc);
  uVar4 = Func::GetLocalFunctionId(instr->m_func->topFunc);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,CheckThisPhase,uVar3,uVar4);
  if (bVar2) {
    return pIVar7;
  }
  uVar3 = Func::GetSourceContextId(instr->m_func->topFunc);
  uVar4 = Func::GetLocalFunctionId(instr->m_func->topFunc);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,CheckThisPhase,uVar3,uVar4);
  if (!bVar2) {
    bVar2 = Func::HasProfileInfo(instr->m_func);
    if (!bVar2) {
      return pIVar7;
    }
    pJVar8 = Func::GetReadOnlyProfileInfo(instr->m_func);
    TVar5 = JITTimeProfileInfo::GetThisInfo(pJVar8);
    if (((uint)TVar5 & 0xff0000) != 0x10000) {
      return pIVar7;
    }
    pJVar8 = Func::GetReadOnlyProfileInfo(instr->m_func);
    bVar2 = JITTimeProfileInfo::IsCheckThisDisabled(pJVar8);
    if (bVar2) {
      return pIVar7;
    }
  }
  if (instr->m_opcode != LdThis) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1609,"(instr->m_opcode == Js::OpCode::LdThis)",
                       "instr->m_opcode == Js::OpCode::LdThis");
    if (!bVar2) goto LAB_0050d8f0;
    *puVar6 = 0;
  }
  if (instr->m_func->parentFunc == (Func *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x160a,"(instr->IsInlined())","instr->IsInlined()");
    if (!bVar2) {
LAB_0050d8f0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  if (instr->m_opcode == LdThis) {
    IR::Instr::FreeSrc2(instr);
  }
  this_00 = IR::BailOutInstrTemplate<IR::Instr>::New(CheckThis,BailOutCheckThis,instr,instr->m_func)
  ;
  IR::Instr::SetSrc1(&this_00->super_Instr,instr->m_src1);
  IR::Instr::SetByteCodeOffset(&this_00->super_Instr,instr);
  pIVar7 = instr;
  IR::Instr::InsertBefore(instr,&this_00->super_Instr);
  pIVar7 = RemoveLdThis((Inline *)pIVar7,instr);
  return pIVar7;
}

Assistant:

IR::Instr *
Inline::DoCheckThisOpt(IR::Instr * instr)
{
    IR::Instr * instrNext = instr->m_next;

    if (PHASE_OFF(Js::CheckThisPhase, instr->m_func->GetTopFunc()))
    {
        return instrNext;
    }

    if (!PHASE_FORCE(Js::CheckThisPhase, instr->m_func->GetTopFunc()))
    {
        if (!instr->m_func->HasProfileInfo())
        {
            return instrNext;
        }

        if (instr->m_func->GetReadOnlyProfileInfo()->GetThisInfo().thisType != Js::ThisType_Simple)
        {
            return instrNext;
        }

        if (instr->m_func->GetReadOnlyProfileInfo()->IsCheckThisDisabled())
        {
            return instrNext;
        }
    }

    // If the instr is an inlined LdThis, try to replace it with a CheckThis
    // that will bail out if a helper call is required to get the real "this" pointer.

    Assert(instr->m_opcode == Js::OpCode::LdThis);
    Assert(instr->IsInlined());

    // Create the CheckThis. The target is the original offset, i.e., the LdThis still has to be executed.
    if(instr->m_opcode == Js::OpCode::LdThis)
    {
        instr->FreeSrc2();
    }
    IR::Instr *newInstr =
        IR::BailOutInstr::New(Js::OpCode::CheckThis, IR::BailOutCheckThis, instr, instr->m_func);
    // Just re-use the original src1 since the LdThis will usually be deleted.
    newInstr->SetSrc1(instr->GetSrc1());
    newInstr->SetByteCodeOffset(instr);
    instr->InsertBefore(newInstr);

    return this->RemoveLdThis(instr);
}